

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall duckdb::HashJoinTableInitEvent::Schedule(HashJoinTableInitEvent *this)

{
  HashJoinGlobalSinkState *pHVar1;
  PhysicalHashJoin *pPVar2;
  bool bVar3;
  Pipeline *this_00;
  type pJVar4;
  HashJoinTableInitTask *pHVar5;
  ulong uVar6;
  idx_t entry_idx_from_p;
  enable_shared_from_this<duckdb::Task> *peVar7;
  ulong entry_idx_to_p;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> finalize_tasks;
  _Head_base<0UL,_duckdb::HashJoinTableInitTask_*,_false> local_c0;
  enable_shared_from_this<duckdb::Event> local_b8;
  shared_ptr<duckdb::Task,_true> local_a8;
  shared_ptr<duckdb::Event,_true> local_98;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_88;
  ClientContext *local_70;
  ulong local_68;
  enable_shared_from_this<duckdb::Event> *local_60;
  ulong local_58;
  ulong local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this->super_BasePipelineEvent).pipeline);
  local_70 = Pipeline::GetClientContext(this_00);
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pJVar4 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator*(&this->sink->hash_table);
  entry_idx_to_p = pJVar4->capacity;
  uVar6 = this->sink->num_threads;
  bVar3 = FinalizeSingleThreaded(this->sink,false);
  if (bVar3) {
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_b8);
    pHVar1 = this->sink;
    pPVar2 = pHVar1->op;
    pHVar5 = (HashJoinTableInitTask *)operator_new(0x68);
    local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_b8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_b8.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_b8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_b8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    HashJoinTableInitTask::HashJoinTableInitTask
              (pHVar5,&local_98,local_70,pHVar1,0,entry_idx_to_p,(PhysicalOperator *)pPVar2);
    local_c0._M_head_impl = pHVar5;
    if (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::HashJoinTableInitTask,std::default_delete<duckdb::HashJoinTableInitTask>,void>
              ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
               (unique_ptr<duckdb::HashJoinTableInitTask,_std::default_delete<duckdb::HashJoinTableInitTask>_>
                *)&local_c0);
    peVar7 = &(local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->super_enable_shared_from_this<duckdb::Task>;
    if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (Task *)0x0) {
      peVar7 = (enable_shared_from_this<duckdb::Task> *)0x0;
    }
    shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
              (&local_a8,peVar7,
               local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&local_88,&local_a8);
    if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c0._M_head_impl != (HashJoinTableInitTask *)0x0) {
      (*((local_c0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
    }
    local_c0._M_head_impl = (HashJoinTableInitTask *)0x0;
    if (local_b8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.__weak_this_.internal.
                 super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  else {
    uVar6 = entry_idx_to_p / uVar6 >> 2;
    local_58 = 0x20000;
    if (0x20000 < uVar6) {
      local_58 = uVar6;
    }
    if (entry_idx_to_p != 0) {
      local_60 = &(this->super_BasePipelineEvent).super_Event.
                  super_enable_shared_from_this<duckdb::Event>;
      entry_idx_from_p = 0;
      local_68 = entry_idx_to_p;
      do {
        local_50 = local_58 + entry_idx_from_p;
        if (local_50 < entry_idx_to_p) {
          entry_idx_to_p = local_50;
        }
        enable_shared_from_this<duckdb::Event>::shared_from_this(&local_b8);
        pHVar1 = this->sink;
        pPVar2 = pHVar1->op;
        pHVar5 = (HashJoinTableInitTask *)operator_new(0x68);
        local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_b8.__weak_this_.internal.
             super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_b8.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_b8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_b8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        HashJoinTableInitTask::HashJoinTableInitTask
                  (pHVar5,&local_98,local_70,pHVar1,entry_idx_from_p,entry_idx_to_p,
                   (PhysicalOperator *)pPVar2);
        local_c0._M_head_impl = pHVar5;
        if (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<duckdb::HashJoinTableInitTask,std::default_delete<duckdb::HashJoinTableInitTask>,void>
                  ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                   (unique_ptr<duckdb::HashJoinTableInitTask,_std::default_delete<duckdb::HashJoinTableInitTask>_>
                    *)&local_c0);
        entry_idx_to_p = local_68;
        peVar7 = &(local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_enable_shared_from_this<duckdb::Task>;
        if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (Task *)0x0) {
          peVar7 = (enable_shared_from_this<duckdb::Task> *)0x0;
        }
        shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
                  (&local_a8,peVar7,
                   local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        ::std::
        vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
        ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                  ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                    *)&local_88,&local_a8);
        if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_c0._M_head_impl != (HashJoinTableInitTask *)0x0) {
          (*((local_c0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
        }
        local_c0._M_head_impl = (HashJoinTableInitTask *)0x0;
        if (local_b8.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.__weak_this_.internal.
                     super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        entry_idx_from_p = local_50;
      } while (local_50 < entry_idx_to_p);
    }
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void Schedule() override {
		auto &context = pipeline->GetClientContext();
		vector<shared_ptr<Task>> finalize_tasks;
		auto &ht = *sink.hash_table;
		const auto entry_count = ht.capacity;
		auto num_threads = NumericCast<idx_t>(sink.num_threads);

		// we don't have to check whether it is too skewed here, as we only initialize the pointer table
		if (FinalizeSingleThreaded(sink, false)) {
			// Single-threaded memset
			finalize_tasks.push_back(
			    make_uniq<HashJoinTableInitTask>(shared_from_this(), context, sink, 0U, entry_count, sink.op));
		} else {
			// have 4 times more tasks than threads, but bound the to a minimum
			const idx_t entries_per_task = MaxValue(entry_count / num_threads / 4, MINIMUM_ENTRIES_PER_TASK);
			// Parallel memset
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx += entries_per_task) {
				auto entry_idx_to = MinValue<idx_t>(entry_idx + entries_per_task, entry_count);
				finalize_tasks.push_back(make_uniq<HashJoinTableInitTask>(shared_from_this(), context, sink, entry_idx,
				                                                          entry_idx_to, sink.op));
			}
		}
		SetTasks(std::move(finalize_tasks));
	}